

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::VerifyCheckPad(Recycler *this,void *address,size_t size)

{
  ulong uVar1;
  void *corruptedAddress;
  long lVar2;
  
  uVar1 = *(ulong *)((long)address + (size - 8));
  if (uVar1 == 0xcacacacacacacaca) {
    VerifyCheckFill(address,size);
    return;
  }
  corruptedAddress = (void *)((long)address + (size - 8));
  VerifyCheck((uint)(uVar1 < size && (ulong)this->verifyPad + 8 <= uVar1),L"Invalid padding size",
              address,corruptedAddress);
  if ((void *)((long)address + (size - uVar1)) < corruptedAddress) {
    lVar2 = -uVar1;
    do {
      VerifyCheck((uint)(*(char *)((long)address + lVar2 + size) == -0x36),L"buffer overflow",
                  address,(void *)((long)address + lVar2 + size));
      lVar2 = lVar2 + 1;
    } while (lVar2 != -8);
  }
  return;
}

Assistant:

void Recycler::VerifyCheckPad(void * address, size_t size)
{
    size_t * paddingAddress = (size_t *)((byte *)address + size - sizeof(size_t));
    size_t padding = *paddingAddress;

#pragma warning(suppress:4310)
    if (padding == (size_t)0xCACACACACACACACA)
    {
        // Nascent block have objects that are not initialized with pad size
        Recycler::VerifyCheckFill(address, size);
        return;
    }
    Recycler::VerifyCheck(padding >= verifyPad + sizeof(size_t) &&  padding < size, _u("Invalid padding size"), address, paddingAddress);
    for (byte * i = (byte *)address + size - padding; i < (byte *)paddingAddress; i++)
    {
        Recycler::VerifyCheck(*i == Recycler::VerifyMemFill, _u("buffer overflow"), address, i);
    }
}